

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureUnitCase::init(TextureUnitCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *this_00;
  int iVar1;
  deBool dVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  ContextInfo *pCVar5;
  TestLog *this_01;
  MessageBuilder *this_02;
  size_type sVar6;
  Texture2D *this_03;
  TextureCube *this_04;
  Texture2DArray *this_05;
  Texture3D *this_06;
  reference ppTVar7;
  reference ppTVar8;
  reference ppTVar9;
  reference ppTVar10;
  iterator first;
  iterator last;
  ChannelType *pCVar11;
  ChannelOrder *pCVar12;
  reference pvVar13;
  reference pvVar14;
  MultiTexShader *this_07;
  uint uVar15;
  bool bVar16;
  float fVar17;
  PixelBufferAccess *local_688;
  PixelBufferAccess *local_678;
  PixelBufferAccess *local_668;
  GLenum local_5e8;
  GLenum local_5dc;
  GLenum local_5d4;
  ChannelType local_5b8;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  CaseType local_580;
  int local_554;
  exception *anon_var_0;
  DataType local_534;
  float local_530 [3];
  DataType local_524;
  float local_520 [3];
  DataType local_514;
  float local_510 [3];
  DataType local_504;
  int local_500;
  undefined1 local_4fc [8];
  TextureFormatInfo fmtInfo_1;
  TextureFormat fmt;
  GLenum type_1;
  int texNdx_1;
  int i_1;
  vector<int,_std::allocator<int>_> num2dArrayLayers;
  vector<glu::DataType,_std::allocator<glu::DataType>_> samplerTypes;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texBiases;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> texScales;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unitTypes;
  int local_420;
  value_type_conflict1 local_41c;
  RGBA local_418;
  int i;
  Vector<float,_4> local_404;
  Vec4 local_3f4;
  RGBA local_3e4;
  Vector<float,_4> local_3e0;
  Vector<float,_4> local_3d0;
  Vec4 local_3c0;
  undefined1 local_3b0 [8];
  PixelBufferAccess access;
  int curCellSize;
  int levelNdx;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 alpha;
  deUint32 rgb;
  int face;
  int numFaces;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  value_type_conflict1 local_2fc;
  Texture2DArray *local_2f8;
  value_type_conflict1 local_2ec;
  TextureCube *local_2e8;
  value_type_conflict1 local_2dc;
  Texture2D *local_2d8;
  value_type_conflict1 local_2d0;
  TextureFormat local_2cc;
  TextureFormat texFormat;
  bool isFilterable;
  int numLevels;
  bool mipmaps;
  int texLayers;
  int texDepth;
  int texHeight;
  int texWidth;
  GLenum type;
  bool is3dTex;
  bool is2dArrayTex;
  bool isCubeTex;
  bool is2dTex;
  int texType;
  TextureParameters params;
  int texNdx;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  char *local_1c0;
  MessageBuilder local_1b8;
  undefined1 local_34 [8];
  Random rnd;
  TestLog *log;
  TextureUnitCase *this_local;
  
  if (this->m_numUnitsParam < 1) {
    pCVar5 = gles3::Context::getContextInfo((this->super_TestCase).m_context);
    local_554 = (*pCVar5->_vptr_ContextInfo[2])(pCVar5,0x8872);
  }
  else {
    local_554 = this->m_numUnitsParam;
  }
  this->m_numUnits = local_554;
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  de::Random::Random((Random *)local_34,this->m_randSeed);
  fVar17 = de::Random::getFloat((Random *)local_34);
  if (0.7 <= fVar17) {
    iVar1 = ::deMax32(1,this->m_numUnits + -2);
    iVar1 = de::Random::getInt((Random *)local_34,iVar1,this->m_numUnits);
    this->m_numTextures = iVar1;
  }
  else {
    this->m_numTextures = this->m_numUnits;
  }
  tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  de::toString<int>(&local_260,&this->m_numUnits);
  std::operator+(&local_240,"Using ",&local_260);
  std::operator+(&local_220,&local_240," texture unit(s) and ");
  de::toString<int>((string *)&params.magFilter,&this->m_numTextures);
  std::operator+(&local_200,&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &params.magFilter);
  std::operator+(&local_1e0,&local_200," texture(s)");
  local_1c0 = (char *)std::__cxx11::string::c_str();
  this_02 = tcu::MessageBuilder::operator<<(&local_1b8,&local_1c0);
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&params.magFilter);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->m_textureTypes,(long)this->m_numTextures);
  std::
  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
  ::reserve(&this->m_textureParams,(long)this->m_numTextures);
  std::vector<int,_std::allocator<int>_>::reserve(&this->m_ndxTexType,(long)this->m_numTextures);
  for (params.minFilter = 0; (int)params.minFilter < this->m_numTextures;
      params.minFilter = params.minFilter + 1) {
    if (this->m_caseType == CASE_MIXED) {
      local_580 = de::Random::getInt((Random *)local_34,0,3);
    }
    else {
      local_580 = this->m_caseType;
    }
    type = local_580;
    texWidth._3_1_ = local_580 == CASE_ONLY_2D;
    texWidth._2_1_ = local_580 == CASE_ONLY_CUBE;
    texWidth._1_1_ = local_580 == CASE_ONLY_2D_ARRAY;
    texWidth._0_1_ = local_580 == CASE_ONLY_3D;
    if ((bool)texWidth._3_1_) {
      local_584 = 0xde1;
    }
    else {
      if ((bool)texWidth._2_1_) {
        local_588 = 0x8513;
      }
      else {
        local_588 = 0x806f;
        if ((bool)texWidth._1_1_) {
          local_588 = 0x8c1a;
        }
      }
      local_584 = local_588;
    }
    texHeight = local_584;
    if ((bool)texWidth._3_1_) {
      local_58c = 0x80;
    }
    else {
      if ((bool)texWidth._2_1_) {
        local_590 = 0x100;
      }
      else {
        local_590 = 0x20;
        if ((bool)texWidth._1_1_) {
          local_590 = 0x40;
        }
      }
      local_58c = local_590;
    }
    if ((bool)texWidth._3_1_) {
      local_594 = 0x80;
    }
    else {
      if ((bool)texWidth._2_1_) {
        local_598 = 0x100;
      }
      else {
        local_598 = 0x20;
        if ((bool)texWidth._1_1_) {
          local_598 = 0x40;
        }
      }
      local_594 = local_598;
    }
    iVar1 = 1;
    if ((bool)(undefined1)texWidth) {
      iVar1 = 0x20;
    }
    uVar15 = (uint)texWidth._1_1_;
    dVar2 = ::deIsPowerOfTwo32(local_58c);
    bVar16 = false;
    if (dVar2 != 0) {
      dVar2 = ::deIsPowerOfTwo32(local_594);
      bVar16 = false;
      if (dVar2 != 0) {
        dVar2 = ::deIsPowerOfTwo32(iVar1);
        bVar16 = dVar2 != 0;
      }
    }
    if (bVar16) {
      iVar3 = de::max<int>(local_58c,local_594);
      iVar3 = de::max<int>(iVar3,iVar1);
      iVar3 = ::deLog2Floor32(iVar3);
      local_5b8 = iVar3 + SNORM_INT16;
    }
    else {
      local_5b8 = SNORM_INT16;
    }
    texFormat.type = local_5b8;
    iVar3 = de::Random::getInt((Random *)local_34,0,0x30);
    _is3dTex = *(deUint32 *)(s_testSizedInternalFormats + (long)iVar3 * 4);
    texFormat.order._3_1_ = glu::isGLInternalColorFormatFilterable(_is3dTex);
    iVar3 = de::Random::getInt((Random *)local_34,0,2);
    texType = *(int *)(s_testWrapModes + (long)iVar3 * 4);
    iVar3 = de::Random::getInt((Random *)local_34,0,2);
    params.internalFormat = *(GLenum *)(s_testWrapModes + (long)iVar3 * 4);
    iVar3 = de::Random::getInt((Random *)local_34,0,2);
    params.wrapModeS = *(GLenum *)(s_testWrapModes + (long)iVar3 * 4);
    if ((texFormat.order._3_1_ & 1) == R >> 0x18) {
      local_5d4 = 0x2600;
    }
    else {
      iVar3 = de::Random::getInt((Random *)local_34,0,1);
      local_5d4 = *(GLenum *)((long)&s_testMagFilters + (long)iVar3 * 4);
    }
    params.wrapModeR = local_5d4;
    if (bVar16) {
      if ((texFormat.order._3_1_ & 1) == R >> 0x18) {
        iVar3 = de::Random::getInt((Random *)local_34,0,1);
        local_5dc = *(GLenum *)((long)&s_testNearestMinFilters + (long)iVar3 * 4);
      }
      else {
        iVar3 = de::Random::getInt((Random *)local_34,0,5);
        local_5dc = *(GLenum *)(s_testMinFilters + (long)iVar3 * 4);
      }
      params.wrapModeT = local_5dc;
    }
    else {
      if ((texFormat.order._3_1_ & 1) == R >> 0x18) {
        local_5e8 = 0x2600;
      }
      else {
        iVar3 = de::Random::getInt((Random *)local_34,0,1);
        local_5e8 = *(GLenum *)((long)&s_testNonMipmapMinFilters + (long)iVar3 * 4);
      }
      params.wrapModeT = local_5e8;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_textureTypes,(value_type_conflict4 *)&texHeight);
    std::
    vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
    ::push_back(&this->m_textureParams,(value_type *)&is3dTex);
    local_2cc = glu::mapGLInternalFormat(_is3dTex);
    if ((texWidth._3_1_ & 1) == 0) {
      if ((texWidth._2_1_ & 1) == 0) {
        if ((texWidth._1_1_ & 1) == 0) {
          sVar6 = std::vector<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>::size
                            (&this->m_textures3d);
          local_2fc = (value_type_conflict1)sVar6;
          std::vector<int,_std::allocator<int>_>::push_back(&this->m_ndxTexType,&local_2fc);
          this_06 = (Texture3D *)operator_new(0x58);
          tcu::Texture3D::Texture3D(this_06,&local_2cc,local_58c,local_594,iVar1);
          fmtInfo.lookupBias.m_data._8_8_ = this_06;
          std::vector<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>::push_back
                    (&this->m_textures3d,(value_type *)(fmtInfo.lookupBias.m_data + 2));
        }
        else {
          sVar6 = std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::size
                            (&this->m_textures2dArray);
          local_2ec = (value_type_conflict1)sVar6;
          std::vector<int,_std::allocator<int>_>::push_back(&this->m_ndxTexType,&local_2ec);
          this_05 = (Texture2DArray *)operator_new(0x58);
          tcu::Texture2DArray::Texture2DArray(this_05,&local_2cc,local_58c,local_594,uVar15 * 3 + 1)
          ;
          local_2f8 = this_05;
          std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::push_back
                    (&this->m_textures2dArray,&local_2f8);
        }
      }
      else {
        sVar6 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::size
                          (&this->m_texturesCube);
        local_2dc = (value_type_conflict1)sVar6;
        std::vector<int,_std::allocator<int>_>::push_back(&this->m_ndxTexType,&local_2dc);
        this_04 = (TextureCube *)operator_new(0x168);
        tcu::TextureCube::TextureCube(this_04,&local_2cc,local_58c);
        local_2e8 = this_04;
        std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::push_back
                  (&this->m_texturesCube,&local_2e8);
      }
    }
    else {
      sVar6 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::size
                        (&this->m_textures2d);
      local_2d0 = (value_type_conflict1)sVar6;
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_ndxTexType,&local_2d0);
      this_03 = (Texture2D *)operator_new(0x50);
      tcu::Texture2D::Texture2D(this_03,&local_2cc,local_58c,local_594);
      local_2d8 = this_03;
      std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::push_back
                (&this->m_textures2d,&local_2d8);
    }
    tcu::getTextureFormatInfo((TextureFormatInfo *)(cBias.m_data + 2),&local_2cc);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)(cBias.m_data + 2));
    tcu::operator-((tcu *)&face,(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)(cBias.m_data + 2));
    iVar1 = 1;
    if ((texWidth._2_1_ & 1) != 0) {
      iVar1 = 6;
    }
    for (alpha = 0; (int)alpha < iVar1; alpha = alpha + 1) {
      dVar4 = de::Random::getUint32((Random *)local_34);
      for (access.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
          access.super_ConstPixelBufferAccess.m_data._4_4_ < (int)texFormat.type;
          access.super_ConstPixelBufferAccess.m_data._4_4_ =
               access.super_ConstPixelBufferAccess.m_data._4_4_ + 1) {
        if ((texWidth._3_1_ & 1) == 0) {
          if ((texWidth._2_1_ & 1) == 0) {
            if ((texWidth._1_1_ & 1) == 0) {
              ppTVar10 = std::vector<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>::back
                                   (&this->m_textures3d);
              tcu::Texture3D::allocLevel(*ppTVar10,access.super_ConstPixelBufferAccess.m_data._4_4_)
              ;
            }
            else {
              ppTVar9 = std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::
                        back(&this->m_textures2dArray);
              tcu::Texture2DArray::allocLevel
                        (*ppTVar9,access.super_ConstPixelBufferAccess.m_data._4_4_);
            }
          }
          else {
            ppTVar8 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::back
                                (&this->m_texturesCube);
            tcu::TextureCube::allocLevel
                      (*ppTVar8,alpha,access.super_ConstPixelBufferAccess.m_data._4_4_);
          }
        }
        else {
          ppTVar7 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::back
                              (&this->m_textures2d);
          tcu::Texture2D::allocLevel(*ppTVar7,access.super_ConstPixelBufferAccess.m_data._4_4_);
        }
        access.super_ConstPixelBufferAccess.m_data._0_4_ =
             ::deMax32(1,8 >> (access.super_ConstPixelBufferAccess.m_data._4_1_ & 0x1f));
        if ((texWidth._3_1_ & 1) == 0) {
          if ((texWidth._2_1_ & 1) == 0) {
            if ((texWidth._1_1_ & 1) == 0) {
              ppTVar10 = std::vector<tcu::Texture3D_*,_std::allocator<tcu::Texture3D_*>_>::back
                                   (&this->m_textures3d);
              local_688 = tcu::TextureLevelPyramid::getLevel
                                    (&(*ppTVar10)->super_TextureLevelPyramid,
                                     access.super_ConstPixelBufferAccess.m_data._4_4_);
            }
            else {
              ppTVar9 = std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::
                        back(&this->m_textures2dArray);
              local_688 = tcu::TextureLevelPyramid::getLevel
                                    (&(*ppTVar9)->super_TextureLevelPyramid,
                                     access.super_ConstPixelBufferAccess.m_data._4_4_);
            }
            local_678 = local_688;
          }
          else {
            ppTVar8 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::back
                                (&this->m_texturesCube);
            local_678 = tcu::TextureCube::getLevelFace
                                  (*ppTVar8,access.super_ConstPixelBufferAccess.m_data._4_4_,alpha);
          }
          local_668 = local_678;
        }
        else {
          ppTVar7 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::back
                              (&this->m_textures2d);
          local_668 = tcu::TextureLevelPyramid::getLevel
                                (&(*ppTVar7)->super_TextureLevelPyramid,
                                 access.super_ConstPixelBufferAccess.m_data._4_4_);
        }
        tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_3b0,local_668);
        iVar3 = (int)access.super_ConstPixelBufferAccess.m_data;
        tcu::RGBA::RGBA(&local_3e4,dVar4 & 0xffffff | 0xff000000);
        tcu::RGBA::toVec((RGBA *)&local_3e0);
        tcu::operator*((tcu *)&local_3d0,&local_3e0,(Vector<float,_4> *)&face);
        tcu::operator+((tcu *)&local_3c0,&local_3d0,(Vector<float,_4> *)(cScale.m_data + 2));
        tcu::RGBA::RGBA(&local_418,(dVar4 & 0xffffff ^ 0xffffffff) & 0xffffff | 0xff000000);
        tcu::RGBA::toVec((RGBA *)&i);
        tcu::operator*((tcu *)&local_404,(Vector<float,_4> *)&i,(Vector<float,_4> *)&face);
        tcu::operator+((tcu *)&local_3f4,&local_404,(Vector<float,_4> *)(cScale.m_data + 2));
        tcu::fillWithGrid((PixelBufferAccess *)local_3b0,iVar3,&local_3c0,&local_3f4);
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->m_unitTextures,(long)this->m_numUnits);
  for (local_41c = 0; local_41c < this->m_numTextures; local_41c = local_41c + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_unitTextures,&local_41c);
  }
  while (sVar6 = std::vector<int,_std::allocator<int>_>::size(&this->m_unitTextures),
        (int)sVar6 < this->m_numUnits) {
    local_420 = de::Random::getInt((Random *)local_34,0,this->m_numTextures + -1);
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_unitTextures,&local_420);
  }
  first = std::vector<int,_std::allocator<int>_>::begin(&this->m_unitTextures);
  last = std::vector<int,_std::allocator<int>_>::end(&this->m_unitTextures);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)local_34,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)last._M_current);
  this_00 = &texScales.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &texBiases.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::vector
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)
             &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&texNdx_1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(long)this->m_numUnits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &texBiases.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)this->m_numUnits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,(long)this->m_numUnits);
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::reserve
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)
             &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)this->m_numUnits);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&texNdx_1,(long)this->m_numUnits);
  for (type_1 = 0; (int)type_1 < this->m_numUnits; type_1 = type_1 + 1) {
    pCVar11 = (ChannelType *)
              std::vector<int,_std::allocator<int>_>::operator[]
                        (&this->m_unitTextures,(long)(int)type_1);
    fmt.type = *pCVar11;
    pCVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_textureTypes,(long)(int)fmt.type);
    fmt.order = *pCVar12;
    pvVar13 = std::
              vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
              ::operator[](&this->m_textureParams,(long)(int)fmt.type);
    fmtInfo_1.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(pvVar13->internalFormat);
    tcu::getTextureFormatInfo
              ((TextureFormatInfo *)local_4fc,(TextureFormat *)(fmtInfo_1.lookupBias.m_data + 2));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &texScales.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&fmt.order);
    if (fmt.order == 0x8c1a) {
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&this->m_ndxTexType,(long)(int)fmt.type);
      ppTVar9 = std::vector<tcu::Texture2DArray_*,_std::allocator<tcu::Texture2DArray_*>_>::
                operator[](&this->m_textures2dArray,(long)*pvVar14);
      local_500 = tcu::Texture2DArray::getNumLayers(*ppTVar9);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&texNdx_1,&local_500);
    }
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &texBiases.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)(fmtInfo_1.valueMax.m_data + 2));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)(fmtInfo_1.lookupScale.m_data + 2));
    if (fmt.order == 0xde1) {
      local_510[0] = fmtInfo_1.lookupBias.m_data[2];
      local_510[1] = fmtInfo_1.lookupBias.m_data[3];
      local_504 = glu::getSampler2DType((TextureFormat)fmtInfo_1.lookupBias.m_data._8_8_);
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)
                 &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_504);
    }
    else if (fmt.order == 0x806f) {
      local_534 = glu::getSampler3DType((TextureFormat)fmtInfo_1.lookupBias.m_data._8_8_);
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)
                 &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_534);
    }
    else if (fmt.order == 0x8513) {
      local_520[0] = fmtInfo_1.lookupBias.m_data[2];
      local_520[1] = fmtInfo_1.lookupBias.m_data[3];
      local_514 = glu::getSamplerCubeType((TextureFormat)fmtInfo_1.lookupBias.m_data._8_8_);
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)
                 &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_514);
    }
    else if (fmt.order == 0x8c1a) {
      local_530[0] = fmtInfo_1.lookupBias.m_data[2];
      local_530[1] = fmtInfo_1.lookupBias.m_data[3];
      local_524 = glu::getSampler2DArrayType((TextureFormat)fmtInfo_1.lookupBias.m_data._8_8_);
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::push_back
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)
                 &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_524);
    }
  }
  this_07 = (MultiTexShader *)operator_new(0x1d0);
  dVar4 = de::Random::getUint32((Random *)local_34);
  MultiTexShader::MultiTexShader
            (this_07,dVar4,this->m_numUnits,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &texScales.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<glu::DataType,_std::allocator<glu::DataType>_> *)
             &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &texBiases.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)&texNdx_1);
  this->m_shader = this_07;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&texNdx_1);
  std::vector<glu::DataType,_std::allocator<glu::DataType>_>::~vector
            ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)
             &num2dArrayLayers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &samplerTypes.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &texBiases.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &texScales.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)local_34);
  return extraout_EAX;
}

Assistant:

void TextureUnitCase::init (void)
{
	m_numUnits = m_numUnitsParam > 0 ? m_numUnitsParam : m_context.getContextInfo().getInt(GL_MAX_TEXTURE_IMAGE_UNITS);

	// Make the textures.

	try
	{
		tcu::TestLog&	log	= m_testCtx.getLog();
		de::Random		rnd	(m_randSeed);

		if (rnd.getFloat() < 0.7f)
			m_numTextures = m_numUnits;											// In most cases use one unit per texture.
		else
			m_numTextures = rnd.getInt(deMax32(1, m_numUnits - 2), m_numUnits);	// Sometimes assign same texture to multiple units.

		log << tcu::TestLog::Message << ("Using " + de::toString(m_numUnits) + " texture unit(s) and " + de::toString(m_numTextures) + " texture(s)").c_str() << tcu::TestLog::EndMessage;

		m_textureTypes.reserve(m_numTextures);
		m_textureParams.reserve(m_numTextures);
		m_ndxTexType.reserve(m_numTextures);

		// Generate textures.

		for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		{
			// Either fixed or randomized target types, and randomized parameters for every texture.

			TextureParameters	params;

			DE_STATIC_ASSERT(CASE_ONLY_2D == 0 && CASE_MIXED + 1 == CASE_LAST);

			int						texType			= m_caseType == CASE_MIXED ? rnd.getInt(0, (int)CASE_MIXED - 1) : (int)m_caseType;
			bool					is2dTex			= texType == 0;
			bool					isCubeTex		= texType == 1;
			bool					is2dArrayTex	= texType == 2;
			bool					is3dTex			= texType == 3;

			DE_ASSERT(is2dTex || isCubeTex || is2dArrayTex || is3dTex);

			GLenum					type			= is2dTex		? GL_TEXTURE_2D		: isCubeTex ? GL_TEXTURE_CUBE_MAP	: is2dArrayTex ? GL_TEXTURE_2D_ARRAY		: GL_TEXTURE_3D;
			const int				texWidth		= is2dTex		? TEXTURE_WIDTH_2D	: isCubeTex ? TEXTURE_WIDTH_CUBE	: is2dArrayTex ? TEXTURE_WIDTH_2D_ARRAY		: TEXTURE_WIDTH_3D;
			const int				texHeight		= is2dTex		? TEXTURE_HEIGHT_2D	: isCubeTex ? TEXTURE_HEIGHT_CUBE	: is2dArrayTex ? TEXTURE_HEIGHT_2D_ARRAY	: TEXTURE_HEIGHT_3D;

			const int				texDepth		= is3dTex ? TEXTURE_DEPTH_3D : 1;
			const int				texLayers		= is2dArrayTex ? TEXTURE_LAYERS_2D_ARRAY : 1;

			bool					mipmaps			= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight) && deIsPowerOfTwo32(texDepth));
			int						numLevels		= mipmaps ? deLog2Floor32(de::max(de::max(texWidth, texHeight), texDepth))+1 : 1;

			params.internalFormat = s_testSizedInternalFormats[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testSizedInternalFormats) - 1)];

			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(params.internalFormat);

			params.wrapModeS = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeT = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeR = s_testWrapModes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];

			params.magFilter = isFilterable ? s_testMagFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMagFilters) - 1)] : GL_NEAREST;

			if (mipmaps)
				params.minFilter = isFilterable ?
					s_testMinFilters			[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMinFilters) - 1)] :
					s_testNearestMinFilters		[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNearestMinFilters) - 1)];
			else
				params.minFilter = isFilterable ?
					s_testNonMipmapMinFilters	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNonMipmapMinFilters) - 1)] :
					GL_NEAREST;

			m_textureTypes.push_back(type);
			m_textureParams.push_back(params);

			// Create new texture.

			tcu::TextureFormat texFormat = glu::mapGLInternalFormat((deUint32)params.internalFormat);

			if (is2dTex)
			{
				m_ndxTexType.push_back((int)m_textures2d.size()); // Remember the index this texture has in the 2d texture vector.
				m_textures2d.push_back(new tcu::Texture2D(texFormat, texWidth, texHeight));
			}
			else if (isCubeTex)
			{
				m_ndxTexType.push_back((int)m_texturesCube.size()); // Remember the index this texture has in the cube texture vector.
				DE_ASSERT(texWidth == texHeight);
				m_texturesCube.push_back(new tcu::TextureCube(texFormat, texWidth));
			}
			else if (is2dArrayTex)
			{
				m_ndxTexType.push_back((int)m_textures2dArray.size()); // Remember the index this texture has in the 2d array texture vector.
				m_textures2dArray.push_back(new tcu::Texture2DArray(texFormat, texWidth, texHeight, texLayers));
			}
			else
			{
				m_ndxTexType.push_back((int)m_textures3d.size()); // Remember the index this texture has in the 3d vector.
				m_textures3d.push_back(new tcu::Texture3D(texFormat, texWidth, texHeight, texDepth));
			}

			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFormat);
			Vec4					cBias		= fmtInfo.valueMin;
			Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill with grid texture.

			int numFaces = isCubeTex ? (int)tcu::CUBEFACE_LAST : 1;

			for (int face = 0; face < numFaces; face++)
			{
				deUint32 rgb	= rnd.getUint32() & 0x00ffffff;
				deUint32 alpha	= 0xff000000;

				deUint32 colorA = alpha | rgb;
				deUint32 colorB = alpha | ((~rgb) & 0x00ffffff);

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					if (is2dTex)
						m_textures2d.back()->allocLevel(levelNdx);
					else if (isCubeTex)
						m_texturesCube.back()->allocLevel((tcu::CubeFace)face, levelNdx);
					else if (is2dArrayTex)
						m_textures2dArray.back()->allocLevel(levelNdx);
					else
						m_textures3d.back()->allocLevel(levelNdx);

					int curCellSize = deMax32(1, GRID_CELL_SIZE >> levelNdx); // \note Scale grid cell size for mipmaps.

					tcu::PixelBufferAccess access = is2dTex			? m_textures2d.back()->getLevel(levelNdx)
												  : isCubeTex		? m_texturesCube.back()->getLevelFace(levelNdx, (tcu::CubeFace)face)
												  : is2dArrayTex	? m_textures2dArray.back()->getLevel(levelNdx)
												  :					  m_textures3d.back()->getLevel(levelNdx);

					tcu::fillWithGrid(access, curCellSize, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
				}
			}
		}

		// Assign a texture index to each unit.

		m_unitTextures.reserve(m_numUnits);

		// \note Every texture is used at least once.
		for (int i = 0; i < m_numTextures; i++)
			m_unitTextures.push_back(i);

		// Assign a random texture to remaining units.
		while ((int)m_unitTextures.size() < m_numUnits)
			m_unitTextures.push_back(rnd.getInt(0, m_numTextures - 1));

		rnd.shuffle(m_unitTextures.begin(), m_unitTextures.end());

		// Generate information for shader.

		vector<GLenum>			unitTypes;
		vector<Vec4>			texScales;
		vector<Vec4>			texBiases;
		vector<glu::DataType>	samplerTypes;
		vector<int>				num2dArrayLayers;

		unitTypes.reserve(m_numUnits);
		texScales.reserve(m_numUnits);
		texBiases.reserve(m_numUnits);
		samplerTypes.reserve(m_numUnits);
		num2dArrayLayers.reserve(m_numUnits);

		for (int i = 0; i < m_numUnits; i++)
		{
			int						texNdx		= m_unitTextures[i];
			GLenum					type		= m_textureTypes[texNdx];
			tcu::TextureFormat		fmt			= glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat);
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(fmt);

			unitTypes.push_back(type);

			if (type == GL_TEXTURE_2D_ARRAY)
				num2dArrayLayers.push_back(m_textures2dArray[m_ndxTexType[texNdx]]->getNumLayers());

			texScales.push_back(fmtInfo.lookupScale);
			texBiases.push_back(fmtInfo.lookupBias);

			switch (type)
			{
				case GL_TEXTURE_2D:			samplerTypes.push_back(glu::getSampler2DType(fmt));			break;
				case GL_TEXTURE_CUBE_MAP:	samplerTypes.push_back(glu::getSamplerCubeType(fmt));		break;
				case GL_TEXTURE_2D_ARRAY:	samplerTypes.push_back(glu::getSampler2DArrayType(fmt));	break;
				case GL_TEXTURE_3D:			samplerTypes.push_back(glu::getSampler3DType(fmt));			break;
				default:
					DE_ASSERT(DE_FALSE);
			}
		}

		// Create shader.

		DE_ASSERT(m_shader == DE_NULL);
		m_shader = new MultiTexShader(rnd.getUint32(), m_numUnits, unitTypes, samplerTypes, texScales, texBiases, num2dArrayLayers);
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureUnitCase::deinit();
		throw;
	}
}